

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallLeafHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::SmallLeafHeapBlockT
          (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *bucket,
          ushort objectSize,ushort objectCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ushort objectCount_local;
  ushort objectSize_local;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *bucket_local;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockT
            (&this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,&bucket->super_HeapBucket
             ,objectSize,objectCount,MediumLeafBlockType);
  (this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock._vptr_HeapBlock =
       (_func_int **)&PTR_WBSetBit_01ddfe20;
  if ((1 < objectCount) &&
     (uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                        (&this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>),
     (uint)objectCount == (uVar3 << 0xc) / (uint)objectSize)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                     ,0x20,
                     "(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize)"
                     ,
                     "objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize"
                    );
  if (bVar2) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::SmallLeafHeapBlockT(HeapBucketT<SmallLeafHeapBlockT<MediumAllocationBlockAttributes>> * bucket, ushort objectSize, ushort objectCount)
    : Base(bucket, objectSize, objectCount, HeapBlock::HeapBlockType::MediumLeafBlockType)
{
    Assert(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize);
}